

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void wasm_global_set(wasm_global_t *global,wasm_val_t *val)

{
  Value value;
  bool bVar1;
  Store *store;
  Object *this;
  Global *pGVar2;
  TypedValue local_50;
  u64 local_38;
  undefined8 local_30;
  size_t local_20;
  wasm_val_t *local_18;
  wasm_val_t *val_local;
  wasm_global_t *global_local;
  
  local_18 = val;
  val_local = (wasm_val_t *)global;
  fprintf(_stderr,"CAPI: [%s] \n","wasm_global_set");
  bVar1 = wasm_valkind_is_ref(local_18->kind);
  if (bVar1) {
    pGVar2 = wasm_ref_t::As<wabt::interp::Global>((wasm_ref_t *)val_local);
    store = wabt::interp::RefPtr<wabt::interp::Object>::store
                      ((RefPtr<wabt::interp::Object> *)val_local);
    this = wabt::interp::RefPtr<wabt::interp::Object>::operator->(&((local_18->of).ref)->I);
    local_20 = (size_t)wabt::interp::Object::self(this);
    wabt::interp::Global::Set(pGVar2,store,(Ref)local_20);
  }
  else {
    pGVar2 = wasm_ref_t::As<wabt::interp::Global>((wasm_ref_t *)val_local);
    ToWabtValue(&local_50,local_18);
    local_38 = local_50.value.i64_;
    local_30 = local_50.value._8_8_;
    value._8_8_ = local_50.value._8_8_;
    value.i64_ = local_50.value.i64_;
    wabt::interp::Global::UnsafeSet(pGVar2,value);
  }
  return;
}

Assistant:

void wasm_global_set(wasm_global_t* global, const wasm_val_t* val) {
  TRACE0();
  if (wasm_valkind_is_ref(val->kind)) {
    global->As<Global>()->Set(*global->I.store(), val->of.ref->I->self());
  } else {
    global->As<Global>()->UnsafeSet(ToWabtValue(*val).value);
  }
}